

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*=(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *x)

{
  long lVar1;
  
  if (0 < (long)*(int *)(this + 8)) {
    lVar1 = (long)*(int *)(this + 8) + 1;
    do {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                ((cpp_dec_float<100U,_int,_void> *)
                 ((long)*(int *)(*(long *)(this + 0x10) + -8 + lVar1 * 4) * 0x50 +
                 *(long *)(this + 0x20)),&x->m_backend);
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

SSVectorBase<R>& operator*=(S x)
   {
      assert(isSetup());
      assert(x != S(0));

      for(int i = size() - 1; i >= 0; --i)
         VectorBase<R>::val[index(i)] *= x;

      assert(isConsistent());

      return *this;
   }